

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseDefaultAssignment
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location)

{
  uint uVar1;
  ErrorCollector *pEVar2;
  bool bVar3;
  string *psVar4;
  unsigned_long i;
  unsigned_long i_00;
  protobuf *this_00;
  uint64 max_value;
  uint64 uVar5;
  uint64 value_1;
  double value;
  LocationRecorder location;
  string local_68;
  protobuf *local_48;
  double local_40;
  LocationRecorder local_38;
  
  if ((field->_has_bits_[0] & 0x40) != 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Already set option \"default\".","");
    pEVar2 = this->error_collector_;
    if (pEVar2 != (ErrorCollector *)0x0) {
      (*pEVar2->_vptr_ErrorCollector[2])
                (pEVar2,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_68);
    }
    this->had_errors_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    psVar4 = field->default_value_;
    if (psVar4 != (string *)&internal::kEmptyString_abi_cxx11_) {
      psVar4->_M_string_length = 0;
      *(psVar4->_M_dataplus)._M_p = '\0';
    }
    *(byte *)field->_has_bits_ = (byte)field->_has_bits_[0] & 0xbf;
  }
  bVar3 = Consume(this,"default");
  if ((!bVar3) || (bVar3 = Consume(this,"="), !bVar3)) {
    return false;
  }
  LocationRecorder::LocationRecorder(&local_38,field_location,7);
  LocationRecorder::RecordLegacyLocation(&local_38,&field->super_Message,DEFAULT_VALUE);
  uVar1 = field->_has_bits_[0];
  field->_has_bits_[0] = uVar1 | 0x40;
  if (field->default_value_ == (string *)&internal::kEmptyString_abi_cxx11_) {
    psVar4 = (string *)operator_new(0x20);
    (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
    psVar4->_M_string_length = 0;
    (psVar4->field_2)._M_local_buf[0] = '\0';
    field->default_value_ = psVar4;
  }
  psVar4 = field->default_value_;
  if ((uVar1 & 8) == 0) {
    bVar3 = ConsumeIdentifier(this,psVar4,"Expected identifier.");
    goto LAB_001c5afe;
  }
  switch(field->type_) {
  case 1:
  case 2:
    bVar3 = TryConsume(this,"-");
    if (bVar3) {
      std::__cxx11::string::append((char *)psVar4);
    }
    this_00 = (protobuf *)&local_40;
    bVar3 = ConsumeNumber(this,(double *)this_00,"Expected number.");
    if (!bVar3) goto LAB_001c5afc;
    SimpleDtoa_abi_cxx11_(&local_68,this_00,local_40);
    std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_68._M_dataplus._M_p);
    goto LAB_001c5a81;
  case 3:
  case 0x10:
  case 0x12:
    uVar5 = 0x7fffffffffffffff;
    goto LAB_001c5834;
  case 4:
  case 6:
    uVar5 = 0xffffffffffffffff;
    goto LAB_001c5977;
  case 5:
  case 0xf:
  case 0x11:
    uVar5 = 0x7fffffff;
LAB_001c5834:
    bVar3 = TryConsume(this,"-");
    if (bVar3) {
      std::__cxx11::string::append((char *)psVar4);
      uVar5 = uVar5 + 1;
    }
    bVar3 = ConsumeInteger64(this,uVar5,(uint64 *)&local_48,"Expected integer.");
    if (bVar3) {
      SimpleItoa_abi_cxx11_(&local_68,local_48,i);
      std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_68._M_dataplus._M_p);
LAB_001c5a1e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      goto joined_r0x001c5af6;
    }
    goto LAB_001c5afc;
  case 7:
  case 0xd:
    uVar5 = 0xffffffff;
LAB_001c5977:
    bVar3 = TryConsume(this,"-");
    if (bVar3) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Unsigned field can\'t have negative default value.","");
      pEVar2 = this->error_collector_;
      if (pEVar2 != (ErrorCollector *)0x0) {
        (*pEVar2->_vptr_ErrorCollector[2])
                  (pEVar2,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,&local_68);
      }
      this->had_errors_ = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    bVar3 = ConsumeInteger64(this,uVar5,(uint64 *)&local_48,"Expected integer.");
    if (bVar3) {
      SimpleItoa_abi_cxx11_(&local_68,local_48,i_00);
      std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_68._M_dataplus._M_p);
      goto LAB_001c5a1e;
    }
    goto LAB_001c5afc;
  case 8:
    bVar3 = TryConsume(this,"true");
    if ((!bVar3) && (bVar3 = TryConsume(this,"false"), !bVar3)) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Expected \"true\" or \"false\".","");
      pEVar2 = this->error_collector_;
      if (pEVar2 != (ErrorCollector *)0x0) {
        (*pEVar2->_vptr_ErrorCollector[2])
                  (pEVar2,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,&local_68);
      }
      goto LAB_001c58e3;
    }
    std::__cxx11::string::assign((char *)psVar4);
    break;
  case 9:
    bVar3 = ConsumeString(this,psVar4,"Expected string.");
    goto joined_r0x001c5af6;
  case 10:
  case 0xb:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Messages can\'t have default values.","");
    pEVar2 = this->error_collector_;
    if (pEVar2 != (ErrorCollector *)0x0) {
      (*pEVar2->_vptr_ErrorCollector[2])
                (pEVar2,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_68);
    }
LAB_001c58e3:
    this->had_errors_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    goto LAB_001c5afc;
  case 0xc:
    bVar3 = ConsumeString(this,psVar4,"Expected string.");
    if (!bVar3) goto LAB_001c5afc;
    CEscape(&local_68,psVar4);
    std::__cxx11::string::operator=((string *)psVar4,(string *)&local_68);
LAB_001c5a81:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    break;
  case 0xe:
    bVar3 = ConsumeIdentifier(this,psVar4,"Expected identifier.");
joined_r0x001c5af6:
    if (bVar3 == false) {
LAB_001c5afc:
      bVar3 = false;
      goto LAB_001c5afe;
    }
  }
  bVar3 = true;
LAB_001c5afe:
  LocationRecorder::~LocationRecorder(&local_38);
  return bVar3;
}

Assistant:

bool Parser::ParseDefaultAssignment(FieldDescriptorProto* field,
                                    const LocationRecorder& field_location) {
  if (field->has_default_value()) {
    AddError("Already set option \"default\".");
    field->clear_default_value();
  }

  DO(Consume("default"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kDefaultValueFieldNumber);
  location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::DEFAULT_VALUE);
  string* default_value = field->mutable_default_value();

  if (!field->has_type()) {
    // The field has a type name, but we don't know if it is a message or an
    // enum yet.  Assume an enum for now.
    DO(ConsumeIdentifier(default_value, "Expected identifier."));
    return true;
  }

  switch (field->type()) {
    case FieldDescriptorProto::TYPE_INT32:
    case FieldDescriptorProto::TYPE_INT64:
    case FieldDescriptorProto::TYPE_SINT32:
    case FieldDescriptorProto::TYPE_SINT64:
    case FieldDescriptorProto::TYPE_SFIXED32:
    case FieldDescriptorProto::TYPE_SFIXED64: {
      uint64 max_value = kint64max;
      if (field->type() == FieldDescriptorProto::TYPE_INT32 ||
          field->type() == FieldDescriptorProto::TYPE_SINT32 ||
          field->type() == FieldDescriptorProto::TYPE_SFIXED32) {
        max_value = kint32max;
      }

      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
        // Two's complement always has one more negative value than positive.
        ++max_value;
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64 value;
      DO(ConsumeInteger64(max_value, &value, "Expected integer."));
      // And stringify it again.
      default_value->append(SimpleItoa(value));
      break;
    }

    case FieldDescriptorProto::TYPE_UINT32:
    case FieldDescriptorProto::TYPE_UINT64:
    case FieldDescriptorProto::TYPE_FIXED32:
    case FieldDescriptorProto::TYPE_FIXED64: {
      uint64 max_value = kuint64max;
      if (field->type() == FieldDescriptorProto::TYPE_UINT32 ||
          field->type() == FieldDescriptorProto::TYPE_FIXED32) {
        max_value = kuint32max;
      }

      // Numeric, not negative.
      if (TryConsume("-")) {
        AddError("Unsigned field can't have negative default value.");
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64 value;
      DO(ConsumeInteger64(max_value, &value, "Expected integer."));
      // And stringify it again.
      default_value->append(SimpleItoa(value));
      break;
    }

    case FieldDescriptorProto::TYPE_FLOAT:
    case FieldDescriptorProto::TYPE_DOUBLE:
      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
      }
      // Parse the integer because we have to convert hex integers to decimal
      // floats.
      double value;
      DO(ConsumeNumber(&value, "Expected number."));
      // And stringify it again.
      default_value->append(SimpleDtoa(value));
      break;

    case FieldDescriptorProto::TYPE_BOOL:
      if (TryConsume("true")) {
        default_value->assign("true");
      } else if (TryConsume("false")) {
        default_value->assign("false");
      } else {
        AddError("Expected \"true\" or \"false\".");
        return false;
      }
      break;

    case FieldDescriptorProto::TYPE_STRING:
      DO(ConsumeString(default_value, "Expected string."));
      break;

    case FieldDescriptorProto::TYPE_BYTES:
      DO(ConsumeString(default_value, "Expected string."));
      *default_value = CEscape(*default_value);
      break;

    case FieldDescriptorProto::TYPE_ENUM:
      DO(ConsumeIdentifier(default_value, "Expected identifier."));
      break;

    case FieldDescriptorProto::TYPE_MESSAGE:
    case FieldDescriptorProto::TYPE_GROUP:
      AddError("Messages can't have default values.");
      return false;
  }

  return true;
}